

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::addCols
          (SPxLPBase<double> *this,SPxColId *id,LPColSetBase<double> *set,bool scale)

{
  DataKey DVar1;
  undefined3 in_register_00000009;
  int n;
  
  n = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xd])
            (this,set,(ulong)CONCAT31(in_register_00000009,scale));
  for (; n < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum; n = n + 1) {
    DVar1 = (DataKey)cId(this,n);
    *id = (SPxColId)DVar1;
    id = (SPxColId *)(&id->super_DataKey + 1);
  }
  return;
}

Assistant:

virtual void addCols(SPxColId id[], const LPColSetBase<R>& set, bool scale = false)
   {

      int i = nCols();
      addCols(set, scale);

      for(int j = 0; i < nCols(); ++i, ++j)
         id[j] = cId(i);
   }